

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O1

string * __thiscall
cmLinkLineComputer::ComputeRPath_abi_cxx11_
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli)

{
  size_type sVar1;
  OutputFormat output;
  _Alloc_hider source;
  string rpathString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  string local_78;
  string local_58;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((cli->RuntimeSep)._M_string_length == 0) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    cmComputeLinkInformation::GetRPath
              (cli,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_58,this->Relink);
    sVar1 = local_58._M_string_length;
    for (source._M_p = local_58._M_dataplus._M_p; source._M_p != (pointer)sVar1;
        source._M_p = source._M_p + 0x20) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(cli->RuntimeFlag)._M_dataplus._M_p);
      output = (OutputFormat)this->UseWatcomQuote;
      if (this->ForResponse != false) {
        output = RESPONSE;
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_78,this->OutputConverter,(string *)source._M_p,output);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  }
  else {
    cmComputeLinkInformation::GetRPathString_abi_cxx11_(&local_78,cli,this->Relink);
    if (local_78._M_string_length != 0) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(cli->RuntimeFlag)._M_dataplus._M_p);
      cmOutputConverter::EscapeForShell
                (&local_58,this->OutputConverter,&local_78,(bool)(this->ForResponse ^ 1),false,false
                );
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeRPath(cmComputeLinkInformation& cli)
{
  std::string rpath;
  // Check what kind of rpath flags to use.
  if (cli.GetRuntimeSep().empty()) {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, this->Relink);

    for (std::string const& rd : runtimeDirs) {
      rpath += cli.GetRuntimeFlag();
      rpath += this->ConvertToOutputFormat(rd);
      rpath += " ";
    }
  } else {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpathString = cli.GetRPathString(this->Relink);

    // Store the rpath option in the stream.
    if (!rpathString.empty()) {
      rpath += cli.GetRuntimeFlag();
      rpath +=
        this->OutputConverter->EscapeForShell(rpathString, !this->ForResponse);
      rpath += " ";
    }
  }
  return rpath;
}